

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O0

void calc_var_all_cols<InputData<double,int>,WorkerMemory<ImputedData<int,double>,double,double>,double>
               (InputData<double,_int> *input_data,
               WorkerMemory<ImputedData<int,_double>,_double,_double> *workspace,
               ModelParams *model_params,double *variances,double *saved_xmin,double *saved_xmax,
               double *saved_means,double *saved_sds)

{
  bool bVar1;
  long lVar2;
  unsigned_long *puVar3;
  size_type sVar4;
  double *pdVar5;
  int *in_RCX;
  size_t in_RDX;
  uint64_t in_RSI;
  uint64_t in_RDI;
  int *in_R8;
  size_t in_R9;
  double dVar6;
  long in_stack_00000008;
  long in_stack_00000010;
  size_t col;
  double xsd;
  double xmean;
  double *in_stack_fffffffffffffed8;
  ModelParams *in_stack_fffffffffffffee0;
  InputData<double,_int> *in_stack_fffffffffffffee8;
  ColumnSampler<double> *in_stack_fffffffffffffef0;
  unsigned_long *in_stack_fffffffffffffef8;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff08;
  double *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  MissingAction in_stack_ffffffffffffff1c;
  ModelParams *in_stack_ffffffffffffff20;
  InputData<double,_int> *in_stack_ffffffffffffff28;
  WorkerMemory<ImputedData<int,_double>,_double,_double> *in_stack_ffffffffffffff30;
  unsigned_long *in_stack_ffffffffffffff38;
  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  *in_stack_ffffffffffffff40;
  double *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  ModelParams *in_stack_ffffffffffffff58;
  InputData<double,_int> *in_stack_ffffffffffffff60;
  unsigned_long *in_stack_ffffffffffffff68;
  size_t *in_stack_ffffffffffffff70;
  int *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  double *in_stack_ffffffffffffff90;
  ModelParams *in_stack_ffffffffffffff98;
  undefined1 local_58 [8];
  double *local_50;
  size_t local_48;
  int *local_40;
  int *local_38;
  size_t local_30;
  uint64_t local_28;
  uint64_t local_20;
  
  if (in_stack_00000008 != 0) {
    *(undefined1 *)(in_RSI + 0x4d0) = 1;
  }
  local_48 = in_R9;
  local_40 = in_R8;
  local_38 = in_RCX;
  local_30 = in_RDX;
  local_28 = in_RSI;
  local_20 = in_RDI;
  ColumnSampler<double>::prepare_full_pass(in_stack_fffffffffffffef0);
  do {
    while( true ) {
      bVar1 = ColumnSampler<double>::sample_col
                        ((ColumnSampler<double> *)in_stack_fffffffffffffee8,
                         (size_t *)in_stack_fffffffffffffee0);
      if (!bVar1) {
        return;
      }
      if (*(ulong *)(local_28 + 0x508) < *(ulong *)(local_20 + 8)) break;
      lVar2 = *(long *)(local_28 + 0x508) - *(long *)(local_20 + 8);
      bVar1 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef0);
      if ((bVar1) &&
         (bVar1 = tsl::
                  robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                  ::empty((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                           *)0x220e25), bVar1)) {
        sVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           (local_28 + 0x3c8));
        if (sVar4 < (long)*(int *)(*(long *)(local_20 + 0x18) + lVar2 * 4) * 2 + 1U) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
        }
        in_stack_ffffffffffffff68 =
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x220ea6);
        in_stack_ffffffffffffff70 = *(size_t **)(local_28 + 0x58);
        in_stack_ffffffffffffff80 =
             (int *)(*(long *)(local_20 + 0x10) + lVar2 * *(long *)(local_20 + 0x30) * 4);
        in_stack_ffffffffffffff88 = *(undefined4 *)(*(long *)(local_20 + 0x18) + lVar2 * 4);
        in_stack_ffffffffffffff8c = *(undefined4 *)(local_30 + 0x88);
        in_stack_fffffffffffffed8 =
             (double *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x220f4d);
        puVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x220f69);
        in_stack_fffffffffffffee0 =
             (ModelParams *)(puVar3 + (long)*(int *)(*(long *)(local_20 + 0x18) + lVar2 * 4) + 1);
        in_stack_fffffffffffffee8 =
             (InputData<double,_int> *)
             std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x220fa8);
        in_stack_ffffffffffffff90 = in_stack_fffffffffffffed8;
        in_stack_ffffffffffffff98 = in_stack_fffffffffffffee0;
        local_58 = (undefined1  [8])
                   expected_sd_cat<unsigned_long,double>
                             ((size_t *)
                              CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                              (size_t)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                              (int *)in_stack_ffffffffffffff00,
                              (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                              (MissingAction)in_stack_fffffffffffffef8,
                              (size_t *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff38,
                              (double *)in_stack_ffffffffffffff40);
      }
      else {
        bVar1 = std::vector<double,_std::allocator<double>_>::empty
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef0);
        if (bVar1) {
          sVar4 = std::vector<double,_std::allocator<double>_>::size
                            ((vector<double,_std::allocator<double>_> *)(local_28 + 0x3b0));
          if (sVar4 < (long)*(int *)(*(long *)(local_20 + 0x18) + lVar2 * 4) * 2 + 1U) {
            std::vector<double,_std::allocator<double>_>::resize
                      (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
          }
          in_stack_fffffffffffffef8 =
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x221268);
          in_stack_ffffffffffffff00 = *(vector<double,_std::allocator<double>_> **)(local_28 + 0x58)
          ;
          in_stack_ffffffffffffff08 = *(size_t *)(local_28 + 0x60);
          in_stack_ffffffffffffff10 =
               (double *)(*(long *)(local_20 + 0x10) + lVar2 * *(long *)(local_20 + 0x30) * 4);
          in_stack_ffffffffffffff18 = *(undefined4 *)(*(long *)(local_20 + 0x18) + lVar2 * 4);
          in_stack_ffffffffffffff1c = *(MissingAction *)(local_30 + 0x88);
          in_stack_fffffffffffffed8 = (double *)(local_28 + 0x80);
          in_stack_fffffffffffffee0 =
               (ModelParams *)
               std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x22130c);
          in_stack_fffffffffffffee8 =
               (InputData<double,_int> *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x221325);
          pdVar5 = std::vector<double,_std::allocator<double>_>::data
                             ((vector<double,_std::allocator<double>_> *)0x22133e);
          in_stack_fffffffffffffef0 =
               (ColumnSampler<double> *)
               (pdVar5 + (long)*(int *)(*(long *)(local_20 + 0x18) + lVar2 * 4) + 1);
          in_stack_ffffffffffffff20 = in_stack_fffffffffffffee0;
          in_stack_ffffffffffffff28 = in_stack_fffffffffffffee8;
          local_58 = (undefined1  [8])
                     expected_sd_cat_weighted<tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,unsigned_long,double>
                               ((size_t *)in_stack_fffffffffffffee8,
                                (size_t)in_stack_fffffffffffffee0,
                                CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                                (int *)in_stack_ffffffffffffff10,
                                (int)(in_stack_ffffffffffffff08 >> 0x20),
                                (MissingAction)in_stack_ffffffffffffff08,in_stack_ffffffffffffff40,
                                in_stack_ffffffffffffff48,
                                (unsigned_long *)
                                CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                (double *)in_stack_ffffffffffffff58);
        }
        else {
          sVar4 = std::vector<double,_std::allocator<double>_>::size
                            ((vector<double,_std::allocator<double>_> *)(local_28 + 0x3b0));
          if (sVar4 < (long)*(int *)(*(long *)(local_20 + 0x18) + lVar2 * 4) * 2 + 1U) {
            std::vector<double,_std::allocator<double>_>::resize
                      (in_stack_ffffffffffffff00,(size_type)in_stack_fffffffffffffef8);
          }
          in_stack_ffffffffffffff30 =
               (WorkerMemory<ImputedData<int,_double>,_double,_double> *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x22109d);
          in_stack_ffffffffffffff38 = *(unsigned_long **)(local_28 + 0x58);
          in_stack_ffffffffffffff40 =
               *(robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 **)(local_28 + 0x60);
          in_stack_ffffffffffffff48 =
               (double *)(*(long *)(local_20 + 0x10) + lVar2 * *(long *)(local_20 + 0x30) * 4);
          in_stack_ffffffffffffff50 = *(undefined4 *)(*(long *)(local_20 + 0x18) + lVar2 * 4);
          in_stack_ffffffffffffff54 = *(undefined4 *)(local_30 + 0x88);
          in_stack_fffffffffffffed8 = (double *)(local_28 + 0xd0);
          in_stack_fffffffffffffee0 =
               (ModelParams *)
               std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x221141);
          in_stack_fffffffffffffee8 =
               (InputData<double,_int> *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x22115d);
          pdVar5 = std::vector<double,_std::allocator<double>_>::data
                             ((vector<double,_std::allocator<double>_> *)0x221179);
          in_stack_fffffffffffffef0 =
               (ColumnSampler<double> *)
               (pdVar5 + (long)*(int *)(*(long *)(local_20 + 0x18) + lVar2 * 4) + 1);
          in_stack_ffffffffffffff58 = in_stack_fffffffffffffee0;
          in_stack_ffffffffffffff60 = in_stack_fffffffffffffee8;
          local_58 = (undefined1  [8])
                     expected_sd_cat_weighted<std::vector<double,std::allocator<double>>,unsigned_long,double>
                               ((size_t *)in_stack_ffffffffffffff28,
                                (size_t)in_stack_ffffffffffffff20,
                                CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                                (int *)in_stack_ffffffffffffff10,
                                (int)(in_stack_ffffffffffffff08 >> 0x20),
                                (MissingAction)in_stack_ffffffffffffff08,
                                (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff40
                                ,in_stack_ffffffffffffff48,
                                (unsigned_long *)
                                CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                (double *)in_stack_fffffffffffffee0);
        }
      }
LAB_002213ae:
      if (((double)local_58 != 0.0) || (NAN((double)local_58))) {
        *(double *)(local_38 + *(long *)(local_28 + 0x508) * 2) =
             (double)local_58 * (double)local_58;
        if (*(long *)(local_28 + 0x4d8) == 0) {
          if (*(long *)(local_20 + 0x50) != 0) {
            *(double *)(local_38 + *(long *)(local_28 + 0x508) * 2) =
                 *(double *)(*(long *)(local_20 + 0x50) + *(long *)(local_28 + 0x508) * 8) *
                 *(double *)(local_38 + *(long *)(local_28 + 0x508) * 2);
          }
        }
        else {
          *(double *)(local_38 + *(long *)(local_28 + 0x508) * 2) =
               *(double *)(*(long *)(local_28 + 0x4d8) + *(long *)(local_28 + 0x508) * 8) *
               *(double *)(local_38 + *(long *)(local_28 + 0x508) * 2);
        }
        dVar6 = *(double *)(local_38 + *(long *)(local_28 + 0x508) * 2);
        if (dVar6 <= 1e-100) {
          dVar6 = 1e-100;
        }
        *(double *)(local_38 + *(long *)(local_28 + 0x508) * 2) = dVar6;
      }
      else {
        ColumnSampler<double>::drop_col
                  ((ColumnSampler<double> *)in_stack_fffffffffffffee0,
                   (size_t)in_stack_fffffffffffffed8);
        lVar2 = *(long *)(local_28 + 0x508);
        (local_38 + lVar2 * 2)[0] = 0;
        (local_38 + lVar2 * 2)[1] = 0;
      }
    }
    get_split_range<InputData<double,int>,WorkerMemory<ImputedData<int,double>,double,double>>
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    if ((*(byte *)(local_28 + 0x108) & 1) == 0) {
      if (local_40 != (int *)0x0) {
        *(undefined8 *)(local_40 + *(long *)(local_28 + 0x508) * 2) =
             *(undefined8 *)(local_28 + 0xf0);
        *(undefined8 *)(local_48 + *(long *)(local_28 + 0x508) * 8) =
             *(undefined8 *)(local_28 + 0xf8);
      }
      if (*(long *)(local_20 + 0x68) == 0) {
        bVar1 = std::vector<double,_std::allocator<double>_>::empty
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef0);
        if ((bVar1) &&
           (bVar1 = tsl::
                    robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                    ::empty((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                             *)0x220990), bVar1)) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x2209a6);
          in_stack_fffffffffffffed8 = (double *)&stack0xffffffffffffffb0;
          calc_mean_and_sd<double,double>
                    ((size_t *)in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8,
                     (size_t)in_stack_fffffffffffffef0,(double *)in_stack_fffffffffffffee8,
                     (MissingAction)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                     in_stack_fffffffffffffed8,in_stack_ffffffffffffff10);
        }
        else {
          bVar1 = std::vector<double,_std::allocator<double>_>::empty
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef0);
          if (bVar1) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x220adc);
            in_stack_fffffffffffffed8 = (double *)local_58;
            in_stack_fffffffffffffee0 = (ModelParams *)&stack0xffffffffffffffb0;
            calc_mean_and_sd_weighted<double,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
                      ((size_t *)in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38,
                       (size_t)in_stack_ffffffffffffff30,(double *)in_stack_ffffffffffffff28,
                       (robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                        *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
                       (double *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (double *)in_stack_ffffffffffffff58);
          }
          else {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x220a45);
            in_stack_fffffffffffffed8 = (double *)local_58;
            in_stack_fffffffffffffee0 = (ModelParams *)&stack0xffffffffffffffb0;
            calc_mean_and_sd_weighted<double,std::vector<double,std::allocator<double>>,double>
                      ((size_t *)in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38,
                       (size_t)in_stack_ffffffffffffff30,(double *)in_stack_ffffffffffffff28,
                       (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff20,
                       in_stack_ffffffffffffff1c,
                       (double *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (double *)in_stack_ffffffffffffff58);
          }
        }
      }
      else {
        bVar1 = std::vector<double,_std::allocator<double>_>::empty
                          ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef0);
        if ((bVar1) &&
           (bVar1 = tsl::
                    robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                    ::empty((robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                             *)0x220b99), bVar1)) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x220baf);
          in_stack_fffffffffffffed8 = *(double **)(local_20 + 0x68);
          in_stack_fffffffffffffee0 = (ModelParams *)local_58;
          in_stack_fffffffffffffee8 = (InputData<double,_int> *)&stack0xffffffffffffffb0;
          calc_mean_and_sd<double,int,double>
                    ((size_t *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                     (size_t)in_stack_ffffffffffffff00,(size_t)in_stack_fffffffffffffef8,
                     (double *)in_stack_fffffffffffffef0,(int *)in_stack_fffffffffffffee8,
                     (int *)in_stack_ffffffffffffff20,(double *)in_stack_ffffffffffffff28,
                     (double *)in_stack_ffffffffffffff30);
        }
        else {
          bVar1 = std::vector<double,_std::allocator<double>_>::empty
                            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffef0);
          if (bVar1) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x220ce4);
            in_stack_fffffffffffffed8 = *(double **)(local_20 + 0x68);
            in_stack_fffffffffffffef0 = (ColumnSampler<double> *)(local_28 + 0x80);
            in_stack_fffffffffffffee0 = (ModelParams *)local_58;
            in_stack_fffffffffffffee8 = (InputData<double,_int> *)&stack0xffffffffffffffb0;
            calc_mean_and_sd_weighted<double,int,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
                      (in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68,
                       (size_t)in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,
                       (double *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (int *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff80,
                       (double *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       in_stack_ffffffffffffff90,
                       (robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                        *)in_stack_ffffffffffffff98);
          }
          else {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x220c4e);
            in_stack_fffffffffffffed8 = *(double **)(local_20 + 0x68);
            in_stack_fffffffffffffef0 = (ColumnSampler<double> *)(local_28 + 0xd0);
            in_stack_fffffffffffffee0 = (ModelParams *)local_58;
            in_stack_fffffffffffffee8 = (InputData<double,_int> *)&stack0xffffffffffffffb0;
            calc_mean_and_sd_weighted<double,int,std::vector<double,std::allocator<double>>,double>
                      (in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68,
                       (size_t)in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58,
                       (double *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                       (int *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff80,
                       (double *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       in_stack_ffffffffffffff90,
                       (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff98);
          }
        }
      }
      if (in_stack_00000008 != 0) {
        *(double **)(in_stack_00000008 + *(long *)(local_28 + 0x508) * 8) = local_50;
      }
      if (in_stack_00000010 != 0) {
        *(undefined1 (*) [8])(in_stack_00000010 + *(long *)(local_28 + 0x508) * 8) = local_58;
      }
      goto LAB_002213ae;
    }
    ColumnSampler<double>::drop_col
              ((ColumnSampler<double> *)in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8)
    ;
    lVar2 = *(long *)(local_28 + 0x508);
    (local_38 + lVar2 * 2)[0] = 0;
    (local_38 + lVar2 * 2)[1] = 0;
    if (local_40 != (int *)0x0) {
      lVar2 = *(long *)(local_28 + 0x508);
      (local_40 + lVar2 * 2)[0] = 0;
      (local_40 + lVar2 * 2)[1] = 0;
      *(undefined8 *)(local_48 + *(long *)(local_28 + 0x508) * 8) = 0;
    }
  } while( true );
}

Assistant:

void calc_var_all_cols(InputData &input_data, WorkerMemory &workspace, ModelParams &model_params,
                       double *restrict variances, double *restrict saved_xmin, double *restrict saved_xmax,
                       double *restrict saved_means, double *restrict saved_sds)
{
    double xmean, xsd;
    if (saved_means != NULL)
        workspace.has_saved_stats = true;

    workspace.col_sampler.prepare_full_pass();
    while (workspace.col_sampler.sample_col(workspace.col_chosen))
    {
        if (workspace.col_chosen < input_data.ncols_numeric)
        {
            get_split_range(workspace, input_data, model_params);
            if (workspace.unsplittable)
            {
                workspace.col_sampler.drop_col(workspace.col_chosen);
                variances[workspace.col_chosen] = 0;
                if (saved_xmin != NULL)
                {
                    saved_xmin[workspace.col_chosen] = 0;
                    saved_xmax[workspace.col_chosen] = 0;
                }
                continue;
            }

            if (saved_xmin != NULL)
            {
                saved_xmin[workspace.col_chosen] = workspace.xmin;
                saved_xmax[workspace.col_chosen] = workspace.xmax;
            }


            if (input_data.Xc_indptr == NULL)
            {
                if (workspace.weights_arr.empty() && workspace.weights_map.empty())
                {
                    calc_mean_and_sd<typename std::remove_pointer<decltype(input_data.numeric_data)>::type, ldouble_safe>(
                                     workspace.ix_arr.data(), workspace.st, workspace.end,
                                     input_data.numeric_data + workspace.col_chosen * input_data.nrows,
                                     model_params.missing_action, xsd, xmean);
                }

                else if (!workspace.weights_arr.empty())
                {
                    calc_mean_and_sd_weighted<typename std::remove_pointer<decltype(input_data.numeric_data)>::type,
                                              decltype(workspace.weights_arr), ldouble_safe>(
                                              workspace.ix_arr.data(), workspace.st, workspace.end,
                                              input_data.numeric_data + workspace.col_chosen * input_data.nrows,
                                              workspace.weights_arr,
                                              model_params.missing_action, xsd, xmean);
                }

                else
                {
                    calc_mean_and_sd_weighted<typename std::remove_pointer<decltype(input_data.numeric_data)>::type,
                                              decltype(workspace.weights_map), ldouble_safe>(
                                              workspace.ix_arr.data(), workspace.st, workspace.end,
                                              input_data.numeric_data + workspace.col_chosen * input_data.nrows,
                                              workspace.weights_map,
                                              model_params.missing_action, xsd, xmean);
                }
            }

            else
            {
                if (workspace.weights_arr.empty() && workspace.weights_map.empty())
                {
                    calc_mean_and_sd<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                     typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                     ldouble_safe>(
                                     workspace.ix_arr.data(), workspace.st, workspace.end,
                                     workspace.col_chosen,
                                     input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                     xsd, xmean);
                }

                else if (!workspace.weights_arr.empty())
                {
                    calc_mean_and_sd_weighted<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                              typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                              decltype(workspace.weights_arr), ldouble_safe>(
                                              workspace.ix_arr.data(), workspace.st, workspace.end,
                                              workspace.col_chosen,
                                              input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                              xsd, xmean, workspace.weights_arr);
                }

                else
                {
                    calc_mean_and_sd_weighted<typename std::remove_pointer<decltype(input_data.Xc)>::type,
                                              typename std::remove_pointer<decltype(input_data.Xc_indptr)>::type,
                                              decltype(workspace.weights_map), ldouble_safe>(
                                              workspace.ix_arr.data(), workspace.st, workspace.end,
                                              workspace.col_chosen,
                                              input_data.Xc, input_data.Xc_ind, input_data.Xc_indptr,
                                              xsd, xmean, workspace.weights_map);
                }
            }

            if (saved_means != NULL) saved_means[workspace.col_chosen] = xmean;
            if (saved_sds != NULL) saved_sds[workspace.col_chosen] = xsd;
        }

        else
        {
            size_t col = workspace.col_chosen - input_data.ncols_numeric;
            if (workspace.weights_arr.empty() && workspace.weights_map.empty())
            {
                if (workspace.buffer_szt.size() < (size_t)2 * (size_t)input_data.ncat[col] + 1)
                    workspace.buffer_szt.resize((size_t)2 * (size_t)input_data.ncat[col] + 1);
                xsd = expected_sd_cat<size_t, ldouble_safe>(
                                      workspace.ix_arr.data(), workspace.st, workspace.end,
                                      input_data.categ_data + col * input_data.nrows,
                                      input_data.ncat[col],
                                      model_params.missing_action,
                                      workspace.buffer_szt.data(),
                                      workspace.buffer_szt.data() + input_data.ncat[col] + 1,
                                      workspace.buffer_dbl.data());
            }

            else if (!workspace.weights_arr.empty())
            {
                if (workspace.buffer_dbl.size() < (size_t)2 * (size_t)input_data.ncat[col] + 1)
                    workspace.buffer_dbl.resize((size_t)2 * (size_t)input_data.ncat[col] + 1);
                xsd = expected_sd_cat_weighted<decltype(workspace.weights_arr), size_t, ldouble_safe>(
                                               workspace.ix_arr.data(), workspace.st, workspace.end,
                                               input_data.categ_data + col * input_data.nrows,
                                               input_data.ncat[col],
                                               model_params.missing_action, workspace.weights_arr,
                                               workspace.buffer_dbl.data(),
                                               workspace.buffer_szt.data(),
                                               workspace.buffer_dbl.data() + input_data.ncat[col] + 1);
            }

            else
            {
                if (workspace.buffer_dbl.size() < (size_t)2 * (size_t)input_data.ncat[col] + 1)
                    workspace.buffer_dbl.resize((size_t)2 * (size_t)input_data.ncat[col] + 1);
                xsd = expected_sd_cat_weighted<decltype(workspace.weights_map), size_t, ldouble_safe>(
                                               workspace.ix_arr.data(), workspace.st, workspace.end,
                                               input_data.categ_data + col * input_data.nrows,
                                               input_data.ncat[col],
                                               model_params.missing_action, workspace.weights_map,
                                               workspace.buffer_dbl.data(),
                                               workspace.buffer_szt.data(),
                                               workspace.buffer_dbl.data() + input_data.ncat[col] + 1);
            }
        }

        if (xsd)
        {
            variances[workspace.col_chosen] = square(xsd);
            if (workspace.tree_kurtoses != NULL)
                variances[workspace.col_chosen] *= workspace.tree_kurtoses[workspace.col_chosen];
            else if (input_data.col_weights != NULL)
                variances[workspace.col_chosen] *= input_data.col_weights[workspace.col_chosen];
            variances[workspace.col_chosen] = std::fmax(variances[workspace.col_chosen], 1e-100);
        }

        else
        {
            workspace.col_sampler.drop_col(workspace.col_chosen);
            variances[workspace.col_chosen] = 0;
        }
    }
}